

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O1

word zzAddMulW(word *b,word *a,size_t n,word w)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  word wVar7;
  size_t sVar8;
  
  if (n == 0) {
    wVar7 = 0;
  }
  else {
    sVar8 = 0;
    wVar7 = 0;
    do {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = wVar7;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = w;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = a[sVar8];
      auVar5 = auVar3 * auVar4 + auVar5;
      uVar6 = auVar5._0_8_;
      puVar1 = b + sVar8;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar6;
      wVar7 = auVar5._8_8_ + (ulong)CARRY8(uVar2,uVar6);
      sVar8 = sVar8 + 1;
    } while (n != sVar8);
  }
  return wVar7;
}

Assistant:

word zzAddMulW(word b[], const word a[], size_t n, register word w)
{
	register word carry = 0;
	register dword prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		zzMul11(prod, w, a[i]);
		prod += carry;
		prod += b[i];
		b[i] = (word)prod;
		carry = (word)(prod >> B_PER_W);
	}
	prod = 0, w = 0;
	return carry;
}